

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::submit::load(submit *this,context *context)

{
  bool bVar1;
  long *in_RDI;
  base_widget *in_stack_ffffffffffffff78;
  base_widget *in_stack_ffffffffffffff80;
  _Self local_50;
  request *in_stack_ffffffffffffffb8;
  string local_38 [32];
  _Self local_18 [3];
  
  base_widget::pre_load(in_stack_ffffffffffffff80,(context *)in_stack_ffffffffffffff78);
  base_widget::set((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),true);
  http::context::request((context *)0x3fd8b8);
  http::request::post_or_get_abi_cxx11_(in_stack_ffffffffffffffb8);
  base_widget::name_abi_cxx11_(in_stack_ffffffffffffff78);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_ffffffffffffff78,(key_type *)0x3fd8f2);
  http::context::request((context *)0x3fd90d);
  http::request::post_or_get_abi_cxx11_(in_stack_ffffffffffffffb8);
  local_50._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = std::operator!=(local_18,&local_50);
  *(bool *)(in_RDI + 7) = bVar1;
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void submit::load(http::context &context)
{
	pre_load(context);
	set(true);
	pressed_ = context.request().post_or_get().find(name()) != context.request().post_or_get().end();
}